

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerSafe::RequestToken
          (Error *__return_storage_ptr__,CommissionerSafe *this,ByteArray *aSignedToken,
          string *aAddr,uint16_t aPort)

{
  promise<ot::commissioner::Error> local_98;
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  local_78;
  undefined1 local_58 [8];
  anon_class_16_2_f437bb86 wait;
  promise<ot::commissioner::Error> pro;
  uint16_t aPort_local;
  string *aAddr_local;
  ByteArray *aSignedToken_local;
  CommissionerSafe *this_local;
  
  std::promise<ot::commissioner::Error>::promise
            ((promise<ot::commissioner::Error> *)&wait.aSignedToken);
  local_58 = (undefined1  [8])&wait.aSignedToken;
  wait.pro = (promise<ot::commissioner::Error> *)aSignedToken;
  std::
  function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const*,ot::commissioner::Error)>
  ::
  function<ot::commissioner::CommissionerSafe::RequestToken(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string_const&,unsigned_short)::__0&,void>
            ((function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const*,ot::commissioner::Error)>
              *)&local_78,(anon_class_16_2_f437bb86 *)local_58);
  (*(this->super_Commissioner)._vptr_Commissioner[0x33])(this,&local_78,aAddr,(ulong)aPort);
  std::
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  ::~function(&local_78);
  std::promise<ot::commissioner::Error>::get_future(&local_98);
  std::future<ot::commissioner::Error>::get
            (__return_storage_ptr__,(future<ot::commissioner::Error> *)&local_98);
  std::future<ot::commissioner::Error>::~future((future<ot::commissioner::Error> *)&local_98);
  std::promise<ot::commissioner::Error>::~promise
            ((promise<ot::commissioner::Error> *)&wait.aSignedToken);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::RequestToken(ByteArray &aSignedToken, const std::string &aAddr, uint16_t aPort)
{
    std::promise<Error> pro;
    auto                wait = [&pro, &aSignedToken](const ByteArray *signedToken, Error error) {
        if (signedToken != nullptr)
        {
            aSignedToken = *signedToken;
        }
        pro.set_value(error);
    };

    RequestToken(wait, aAddr, aPort);
    return pro.get_future().get();
}